

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixShmLock(sqlite3_file *fd,int ofst,int n,int flags)

{
  sqlite3_io_methods *psVar1;
  long lVar2;
  ushort uVar3;
  ushort local_4a;
  ushort local_48;
  int iStack_44;
  u16 allShared;
  u16 allMask;
  u16 mask;
  int rc;
  unixShmNode *pShmNode;
  unixShm *pX;
  unixShm *p;
  unixFile *pDbFd;
  int flags_local;
  int n_local;
  int ofst_local;
  sqlite3_file *fd_local;
  
  psVar1 = fd[8].pMethods;
  lVar2 = *(long *)psVar1;
  iStack_44 = 0;
  uVar3 = (short)(1 << ((byte)ofst + (char)n & 0x1f)) - (short)(1 << ((byte)ofst & 0x1f));
  sqlite3_mutex_enter(*(sqlite3_mutex **)(lVar2 + 8));
  if ((flags & 1U) == 0) {
    if ((flags & 4U) == 0) {
      for (pShmNode = *(unixShmNode **)(lVar2 + 0x38); pShmNode != (unixShmNode *)0x0;
          pShmNode = (unixShmNode *)pShmNode->pShmMutex) {
        if (((*(ushort *)((long)&pShmNode->zFilename + 4) & uVar3) != 0) ||
           ((*(ushort *)((long)&pShmNode->zFilename + 2) & uVar3) != 0)) {
          iStack_44 = 5;
          break;
        }
      }
      if ((iStack_44 == 0) &&
         (iStack_44 = unixShmSystemLock((unixFile *)fd,1,ofst + 0x78,n), iStack_44 == 0)) {
        *(ushort *)((long)&psVar1->xRead + 4) = *(ushort *)((long)&psVar1->xRead + 4) | uVar3;
      }
    }
    else {
      local_4a = 0;
      for (pShmNode = *(unixShmNode **)(lVar2 + 0x38); pShmNode != (unixShmNode *)0x0;
          pShmNode = (unixShmNode *)pShmNode->pShmMutex) {
        if ((*(ushort *)((long)&pShmNode->zFilename + 4) & uVar3) != 0) {
          iStack_44 = 5;
          break;
        }
        local_4a = local_4a | *(ushort *)((long)&pShmNode->zFilename + 2);
      }
      if (iStack_44 == 0) {
        if ((local_4a & uVar3) == 0) {
          iStack_44 = unixShmSystemLock((unixFile *)fd,0,ofst + 0x78,n);
        }
        else {
          iStack_44 = 0;
        }
      }
      if (iStack_44 == 0) {
        *(ushort *)((long)&psVar1->xRead + 2) = *(ushort *)((long)&psVar1->xRead + 2) | uVar3;
      }
    }
  }
  else {
    local_48 = 0;
    for (pShmNode = *(unixShmNode **)(lVar2 + 0x38); pShmNode != (unixShmNode *)0x0;
        pShmNode = (unixShmNode *)pShmNode->pShmMutex) {
      if ((sqlite3_io_methods *)pShmNode != psVar1) {
        local_48 = local_48 | *(ushort *)((long)&pShmNode->zFilename + 2);
      }
    }
    if ((uVar3 & local_48) == 0) {
      iStack_44 = unixShmSystemLock((unixFile *)fd,2,ofst + 0x78,n);
    }
    else {
      iStack_44 = 0;
    }
    if (iStack_44 == 0) {
      *(ushort *)((long)&psVar1->xRead + 4) =
           *(ushort *)((long)&psVar1->xRead + 4) & (uVar3 ^ 0xffff);
      *(ushort *)((long)&psVar1->xRead + 2) =
           *(ushort *)((long)&psVar1->xRead + 2) & (uVar3 ^ 0xffff);
    }
  }
  sqlite3_mutex_leave(*(sqlite3_mutex **)(lVar2 + 8));
  return iStack_44;
}

Assistant:

static int unixShmLock(
  sqlite3_file *fd,          /* Database file holding the shared memory */
  int ofst,                  /* First lock to acquire or release */
  int n,                     /* Number of locks to acquire or release */
  int flags                  /* What to do with the lock */
){
  unixFile *pDbFd = (unixFile*)fd;      /* Connection holding shared memory */
  unixShm *p = pDbFd->pShm;             /* The shared memory being locked */
  unixShm *pX;                          /* For looping over all siblings */
  unixShmNode *pShmNode = p->pShmNode;  /* The underlying file iNode */
  int rc = SQLITE_OK;                   /* Result code */
  u16 mask;                             /* Mask of locks to take or release */

  assert( pShmNode==pDbFd->pInode->pShmNode );
  assert( pShmNode->pInode==pDbFd->pInode );
  assert( ofst>=0 && ofst+n<=SQLITE_SHM_NLOCK );
  assert( n>=1 );
  assert( flags==(SQLITE_SHM_LOCK | SQLITE_SHM_SHARED)
       || flags==(SQLITE_SHM_LOCK | SQLITE_SHM_EXCLUSIVE)
       || flags==(SQLITE_SHM_UNLOCK | SQLITE_SHM_SHARED)
       || flags==(SQLITE_SHM_UNLOCK | SQLITE_SHM_EXCLUSIVE) );
  assert( n==1 || (flags & SQLITE_SHM_EXCLUSIVE)!=0 );
  assert( pShmNode->hShm>=0 || pDbFd->pInode->bProcessLock==1 );
  assert( pShmNode->hShm<0 || pDbFd->pInode->bProcessLock==0 );

  mask = (1<<(ofst+n)) - (1<<ofst);
  assert( n>1 || mask==(1<<ofst) );
  sqlite3_mutex_enter(pShmNode->pShmMutex);
  if( flags & SQLITE_SHM_UNLOCK ){
    u16 allMask = 0; /* Mask of locks held by siblings */

    /* See if any siblings hold this same lock */
    for(pX=pShmNode->pFirst; pX; pX=pX->pNext){
      if( pX==p ) continue;
      assert( (pX->exclMask & (p->exclMask|p->sharedMask))==0 );
      allMask |= pX->sharedMask;
    }

    /* Unlock the system-level locks */
    if( (mask & allMask)==0 ){
      rc = unixShmSystemLock(pDbFd, F_UNLCK, ofst+UNIX_SHM_BASE, n);
    }else{
      rc = SQLITE_OK;
    }

    /* Undo the local locks */
    if( rc==SQLITE_OK ){
      p->exclMask &= ~mask;
      p->sharedMask &= ~mask;
    } 
  }else if( flags & SQLITE_SHM_SHARED ){
    u16 allShared = 0;  /* Union of locks held by connections other than "p" */

    /* Find out which shared locks are already held by sibling connections.
    ** If any sibling already holds an exclusive lock, go ahead and return
    ** SQLITE_BUSY.
    */
    for(pX=pShmNode->pFirst; pX; pX=pX->pNext){
      if( (pX->exclMask & mask)!=0 ){
        rc = SQLITE_BUSY;
        break;
      }
      allShared |= pX->sharedMask;
    }

    /* Get shared locks at the system level, if necessary */
    if( rc==SQLITE_OK ){
      if( (allShared & mask)==0 ){
        rc = unixShmSystemLock(pDbFd, F_RDLCK, ofst+UNIX_SHM_BASE, n);
      }else{
        rc = SQLITE_OK;
      }
    }

    /* Get the local shared locks */
    if( rc==SQLITE_OK ){
      p->sharedMask |= mask;
    }
  }else{
    /* Make sure no sibling connections hold locks that will block this
    ** lock.  If any do, return SQLITE_BUSY right away.
    */
    for(pX=pShmNode->pFirst; pX; pX=pX->pNext){
      if( (pX->exclMask & mask)!=0 || (pX->sharedMask & mask)!=0 ){
        rc = SQLITE_BUSY;
        break;
      }
    }
  
    /* Get the exclusive locks at the system level.  Then if successful
    ** also mark the local connection as being locked.
    */
    if( rc==SQLITE_OK ){
      rc = unixShmSystemLock(pDbFd, F_WRLCK, ofst+UNIX_SHM_BASE, n);
      if( rc==SQLITE_OK ){
        assert( (p->sharedMask & mask)==0 );
        p->exclMask |= mask;
      }
    }
  }
  sqlite3_mutex_leave(pShmNode->pShmMutex);
  OSTRACE(("SHM-LOCK shmid-%d, pid-%d got %03x,%03x\n",
           p->id, osGetpid(0), p->sharedMask, p->exclMask));
  return rc;
}